

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_find_best_sub_pixel_tree
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  byte bVar1;
  SUBPEL_SEARCH_TYPE SVar2;
  MV_COST_TYPE MVar3;
  ushort uVar4;
  ushort uVar5;
  short sVar6;
  MV_COST_PARAMS *pMVar7;
  SUBPEL_SEARCH_VAR_PARAMS *pSVar8;
  MACROBLOCKD *pMVar9;
  AV1_COMMON *pAVar10;
  MV *best_mv;
  uint uVar11;
  int iVar12;
  scale_factors *psVar13;
  int iVar14;
  short sVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  SubpelMvLimits *pSVar21;
  ulong uVar22;
  ulong uVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  SUBPEL_MOTION_SEARCH_PARAMS *pSVar27;
  ulong uVar28;
  short sVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  uint local_dc;
  SUBPEL_MOTION_SEARCH_PARAMS *local_d8;
  MV left_mv;
  MV left_mv_1;
  MV top_mv;
  MV right_mv;
  MV bottom_mv;
  MV local_b4;
  ulong local_b0;
  MV_COST_PARAMS *local_a8;
  SUBPEL_SEARCH_VAR_PARAMS *local_a0;
  MACROBLOCKD *local_98;
  ulong local_90;
  AV1_COMMON *local_88;
  ulong local_80;
  ulong local_78;
  SubpelMvLimits *local_70;
  MV *local_68;
  ulong local_60;
  ulong local_58;
  int local_4c;
  uint local_48;
  uint local_44;
  long local_40;
  ulong local_38;
  
  bVar1 = ms_params->forced_stop;
  local_4c = ms_params->iters_per_step;
  SVar2 = (ms_params->var_params).subpel_search_type;
  uVar11 = 3 - bVar1;
  uVar16 = 3 - (ms_params->allow_hp == 0);
  if ((int)uVar11 < (int)uVar16) {
    uVar16 = uVar11;
  }
  *bestmv = start_mv;
  if (((*xd->mi)->field_0xa7 & 0x80) == 0) {
    psVar13 = xd->block_ref_scale_factors[0];
  }
  else {
    psVar13 = &cm->sf_identity;
  }
  local_a8 = &ms_params->mv_cost_params;
  local_a0 = &ms_params->var_params;
  local_60 = 0;
  local_d8 = ms_params;
  if ((psVar13->x_scale_fp == -1) || (psVar13->y_scale_fp == -1)) {
LAB_001d2dc3:
    if ((start_mv_stats != (FULLPEL_MV_STATS *)0x0) && ((int)local_60 == 0)) {
      local_dc = start_mv_stats->err_cost + start_mv_stats->distortion;
      *distortion = start_mv_stats->distortion;
      *sse1 = start_mv_stats->sse;
      local_60 = 0;
      goto LAB_001d2e6b;
    }
  }
  else {
    local_60 = 1;
    if (psVar13->x_scale_fp == 0x4000) {
      local_60 = (ulong)(psVar13->y_scale_fp != 0x4000);
      goto LAB_001d2dc3;
    }
  }
  if (SVar2 == '\0') {
    local_dc = setup_center_error(xd,bestmv,local_a0,local_a8,sse1,distortion);
  }
  else {
    local_dc = upsampled_setup_center_error(xd,cm,bestmv,local_a0,local_a8,sse1,distortion);
  }
LAB_001d2e6b:
  uVar11 = local_dc;
  if (bVar1 < 3) {
    pSVar21 = &local_d8->mv_limits;
    local_40 = -(ulong)uVar16;
    uVar31 = 4;
    bVar32 = true;
    uVar20 = 1;
    pSVar27 = local_d8;
    local_98 = xd;
    local_88 = cm;
    local_70 = pSVar21;
    local_68 = bestmv;
    local_38 = (ulong)uVar16;
    do {
      pAVar10 = local_88;
      pSVar8 = local_a0;
      uVar4 = bestmv->row;
      uVar23 = (ulong)uVar4;
      uVar5 = bestmv->col;
      uVar17 = (ulong)uVar5;
      if (last_mv_search_list != (int_mv *)0x0) {
        if ((uVar4 == last_mv_search_list[uVar20 - 1].as_mv.row) &&
           (uVar5 == *(ushort *)((long)last_mv_search_list + uVar20 * 4 + -2))) break;
        last_mv_search_list[uVar20 - 1].as_mv.row = uVar4;
        *(ushort *)((long)last_mv_search_list + uVar20 * 4 + -2) = uVar5;
      }
      sVar6 = (short)uVar31;
      left_mv.col = uVar5 - sVar6;
      if (SVar2 == '\0') {
        left_mv_1.col = left_mv.col;
        left_mv_1.row = uVar4;
        left_mv.row = 0;
        left_mv.col = 0;
        local_b0 = uVar20;
        local_90 = uVar31;
        local_80 = uVar23;
        local_78 = uVar17;
        uVar16 = check_better_fast(local_98,local_88,&left_mv_1,bestmv,pSVar21,local_a0,local_a8,
                                   &local_dc,sse1,distortion,(int *)&left_mv,(int)local_60);
        best_mv = local_68;
        pMVar9 = local_98;
        pMVar7 = local_a8;
        local_58 = CONCAT44(local_58._4_4_,uVar16);
        sVar6 = (short)local_78;
        right_mv.col = (short)local_90 + sVar6;
        right_mv.row = uVar4;
        iVar12 = (int)local_60;
        local_44 = check_better_fast(local_98,pAVar10,&right_mv,local_68,pSVar21,pSVar8,local_a8,
                                     &local_dc,sse1,distortion,(int *)&left_mv,iVar12);
        pSVar21 = local_70;
        pAVar10 = local_88;
        pSVar8 = local_a0;
        top_mv.col = sVar6;
        top_mv.row = (short)local_80 - (short)local_90;
        local_48 = check_better_fast(pMVar9,local_88,&top_mv,best_mv,local_70,local_a0,pMVar7,
                                     &local_dc,sse1,distortion,(int *)&left_mv,iVar12);
        uVar31 = local_90;
        bottom_mv.col = (int16_t)local_78;
        bottom_mv.row = (short)local_90 + (short)local_80;
        uVar18 = check_better_fast(local_98,pAVar10,&bottom_mv,best_mv,pSVar21,pSVar8,pMVar7,
                                   &local_dc,sse1,distortion,(int *)&left_mv,iVar12);
        bestmv = local_68;
        pSVar21 = local_70;
        uVar17 = local_78;
        uVar23 = local_80;
        uVar11 = (uint)uVar31;
        uVar16 = uVar11;
        if (local_48 <= uVar18) {
          uVar16 = -uVar11;
        }
        if ((uint)local_58 <= local_44) {
          uVar11 = -uVar11;
        }
        uVar18 = uVar16 & 0xffff | uVar11 << 0x10;
        local_b4.col = (short)local_78 + (short)uVar11;
        local_b4.row = (short)uVar16 + (short)local_80;
        check_better_fast(local_98,local_88,&local_b4,local_68,local_70,local_a0,local_a8,&local_dc,
                          sse1,distortion,(int *)&left_mv,(int)local_60);
        uVar20 = local_b0;
        pSVar27 = local_d8;
      }
      else {
        left_mv.row = uVar4;
        right_mv.col = uVar5 + sVar6;
        right_mv.row = uVar4;
        top_mv.col = uVar5;
        top_mv.row = uVar4 - sVar6;
        bottom_mv.col = uVar5;
        bottom_mv.row = uVar4 + sVar6;
        iVar12 = pSVar21->col_min;
        if (((left_mv.col < iVar12) || ((pSVar27->mv_limits).col_max < (int)left_mv.col)) ||
           ((int)(short)uVar4 < (pSVar27->mv_limits).row_min)) {
          uVar22 = 0x7fffffff;
        }
        else {
          uVar22 = 0x7fffffff;
          if ((int)(short)uVar4 <= (pSVar27->mv_limits).row_max) {
            local_b0 = uVar20;
            local_80 = uVar23;
            local_78 = uVar17;
            iVar12 = upsampled_pref_error(local_98,local_88,&left_mv,local_a0,(uint *)&left_mv_1);
            MVar3 = (local_d8->mv_cost_params).mv_cost_type;
            iVar14 = 0;
            if (MVar3 != '\x04') {
              sVar6 = local_a8->ref_mv->row;
              sVar15 = local_a8->ref_mv->col;
              sVar24 = left_mv.row - sVar6;
              sVar26 = left_mv.col - sVar15;
              sVar25 = -sVar24;
              if (0 < sVar24) {
                sVar25 = sVar24;
              }
              sVar29 = -sVar26;
              if (0 < sVar26) {
                sVar29 = sVar26;
              }
              if (MVar3 == '\x03') {
                iVar14 = (int)sVar29 + (int)sVar25 >> 3;
              }
              else if (MVar3 == '\x01') {
                iVar14 = (int)sVar29 + (int)sVar25 >> 2;
              }
              else if (MVar3 == '\0') {
                iVar14 = (int)(((long)(local_d8->mv_cost_params).mvcost[1][sVar26] +
                                (long)(local_d8->mv_cost_params).mvcost[0][sVar24] +
                               (long)*(int *)((long)(local_d8->mv_cost_params).mvjcost +
                                             (ulong)((uint)(left_mv.col != sVar15) * 4 +
                                                    (uint)(left_mv.row != sVar6) * 8))) *
                               (long)(local_d8->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
                bestmv = local_68;
              }
            }
            uVar16 = iVar14 + iVar12;
            uVar22 = (ulong)uVar16;
            if (uVar16 < local_dc) {
              *bestmv = left_mv;
              *distortion = iVar12;
              *sse1 = (uint)left_mv_1;
              local_dc = uVar16;
            }
            iVar12 = local_70->col_min;
            uVar17 = local_78;
            uVar20 = local_b0;
            pSVar21 = local_70;
            uVar23 = local_80;
            pSVar27 = local_d8;
          }
        }
        uVar19 = 0x7fffffff;
        if (((iVar12 <= (int)right_mv >> 0x10) &&
            ((int)right_mv >> 0x10 <= (pSVar27->mv_limits).col_max)) &&
           (((pSVar27->mv_limits).row_min <= (int)right_mv.row &&
            ((int)right_mv.row <= (pSVar27->mv_limits).row_max)))) {
          local_b0 = uVar20;
          local_90 = uVar22;
          local_80 = uVar23;
          local_78 = uVar17;
          iVar12 = upsampled_pref_error(local_98,local_88,&right_mv,local_a0,(uint *)&left_mv_1);
          MVar3 = (local_d8->mv_cost_params).mv_cost_type;
          iVar14 = 0;
          if (MVar3 != '\x04') {
            sVar6 = local_a8->ref_mv->row;
            sVar15 = local_a8->ref_mv->col;
            sVar24 = right_mv.row - sVar6;
            sVar26 = right_mv.col - sVar15;
            sVar25 = -sVar24;
            if (0 < sVar24) {
              sVar25 = sVar24;
            }
            sVar29 = -sVar26;
            if (0 < sVar26) {
              sVar29 = sVar26;
            }
            if (MVar3 == '\x03') {
              iVar14 = (int)sVar29 + (int)sVar25 >> 3;
            }
            else if (MVar3 == '\x01') {
              iVar14 = (int)sVar29 + (int)sVar25 >> 2;
            }
            else if (MVar3 == '\0') {
              iVar14 = (int)(((long)(local_d8->mv_cost_params).mvcost[1][sVar26] +
                              (long)(local_d8->mv_cost_params).mvcost[0][sVar24] +
                             (long)*(int *)((long)(local_d8->mv_cost_params).mvjcost +
                                           (ulong)((uint)(right_mv.col != sVar15) * 4 +
                                                  (uint)(right_mv.row != sVar6) * 8))) *
                             (long)(local_d8->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
              bestmv = local_68;
            }
          }
          uVar16 = iVar14 + iVar12;
          uVar19 = (ulong)uVar16;
          if (uVar16 < local_dc) {
            *bestmv = right_mv;
            *distortion = iVar12;
            *sse1 = (uint)left_mv_1;
            local_dc = uVar16;
          }
          iVar12 = local_70->col_min;
          uVar17 = local_78;
          uVar20 = local_b0;
          pSVar21 = local_70;
          uVar22 = local_90;
          uVar23 = local_80;
          pSVar27 = local_d8;
        }
        uVar16 = 0x7fffffff;
        if ((((int)top_mv >> 0x10 < iVar12) || ((pSVar27->mv_limits).col_max < (int)top_mv >> 0x10))
           || ((int)top_mv.row < (pSVar27->mv_limits).row_min)) {
          uVar11 = 0x7fffffff;
        }
        else {
          uVar11 = 0x7fffffff;
          if ((int)top_mv.row <= (pSVar27->mv_limits).row_max) {
            local_b0 = uVar20;
            local_90 = uVar22;
            local_80 = uVar23;
            local_78 = uVar17;
            local_58 = uVar19;
            iVar12 = upsampled_pref_error(local_98,local_88,&top_mv,local_a0,(uint *)&left_mv_1);
            MVar3 = (local_d8->mv_cost_params).mv_cost_type;
            iVar14 = 0;
            if (MVar3 != '\x04') {
              sVar6 = local_a8->ref_mv->row;
              sVar15 = local_a8->ref_mv->col;
              sVar26 = top_mv.row - sVar6;
              sVar24 = top_mv.col - sVar15;
              sVar25 = -sVar26;
              if (0 < sVar26) {
                sVar25 = sVar26;
              }
              sVar29 = -sVar24;
              if (0 < sVar24) {
                sVar29 = sVar24;
              }
              if (MVar3 == '\x03') {
                iVar14 = (int)sVar29 + (int)sVar25 >> 3;
              }
              else if (MVar3 == '\x01') {
                iVar14 = (int)sVar29 + (int)sVar25 >> 2;
              }
              else if (MVar3 == '\0') {
                iVar14 = (int)(((long)(local_d8->mv_cost_params).mvcost[1][sVar24] +
                                (long)(local_d8->mv_cost_params).mvcost[0][sVar26] +
                               (long)*(int *)((long)(local_d8->mv_cost_params).mvjcost +
                                             (ulong)((uint)(top_mv.col != sVar15) * 4 +
                                                    (uint)(top_mv.row != sVar6) * 8))) *
                               (long)(local_d8->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
              }
            }
            uVar11 = iVar14 + iVar12;
            if (uVar11 < local_dc) {
              *local_68 = top_mv;
              *distortion = iVar12;
              *sse1 = (uint)left_mv_1;
              local_dc = uVar11;
            }
            iVar12 = local_70->col_min;
            uVar17 = local_78;
            uVar19 = local_58;
            uVar20 = local_b0;
            pSVar21 = local_70;
            uVar22 = local_90;
            uVar23 = local_80;
            pSVar27 = local_d8;
          }
        }
        if ((((iVar12 <= (int)bottom_mv >> 0x10) &&
             ((int)bottom_mv >> 0x10 <= (pSVar27->mv_limits).col_max)) &&
            ((pSVar27->mv_limits).row_min <= (int)bottom_mv.row)) &&
           ((int)bottom_mv.row <= (pSVar27->mv_limits).row_max)) {
          local_b0 = uVar20;
          local_90 = uVar22;
          local_80 = uVar23;
          local_78 = uVar17;
          local_58 = uVar19;
          iVar12 = upsampled_pref_error(local_98,local_88,&bottom_mv,local_a0,(uint *)&left_mv_1);
          MVar3 = (local_d8->mv_cost_params).mv_cost_type;
          iVar14 = 0;
          if (MVar3 != '\x04') {
            sVar6 = local_a8->ref_mv->row;
            sVar15 = local_a8->ref_mv->col;
            sVar26 = bottom_mv.row - sVar6;
            sVar24 = bottom_mv.col - sVar15;
            sVar25 = -sVar26;
            if (0 < sVar26) {
              sVar25 = sVar26;
            }
            sVar29 = -sVar24;
            if (0 < sVar24) {
              sVar29 = sVar24;
            }
            if (MVar3 == '\x03') {
              iVar14 = (int)sVar29 + (int)sVar25 >> 3;
            }
            else if (MVar3 == '\x01') {
              iVar14 = (int)sVar29 + (int)sVar25 >> 2;
            }
            else if (MVar3 == '\0') {
              iVar14 = (int)(((long)(local_d8->mv_cost_params).mvcost[1][sVar24] +
                              (long)(local_d8->mv_cost_params).mvcost[0][sVar26] +
                             (long)*(int *)((long)(local_d8->mv_cost_params).mvjcost +
                                           (ulong)((uint)(bottom_mv.col != sVar15) * 4 +
                                                  (uint)(bottom_mv.row != sVar6) * 8))) *
                             (long)(local_d8->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
            }
          }
          uVar16 = iVar14 + iVar12;
          if (uVar16 < local_dc) {
            *local_68 = bottom_mv;
            *distortion = iVar12;
            *sse1 = (uint)left_mv_1;
            local_dc = uVar16;
          }
          iVar12 = local_70->col_min;
          uVar17 = local_78;
          uVar19 = local_58;
          uVar20 = local_b0;
          pSVar21 = local_70;
          uVar22 = local_90;
          uVar23 = local_80;
          pSVar27 = local_d8;
        }
        uVar30 = uVar31;
        if (uVar11 <= uVar16) {
          uVar30 = (ulong)(uint)-(int)uVar31;
        }
        uVar28 = uVar31;
        if ((uint)uVar22 <= (uint)uVar19) {
          uVar28 = (ulong)(uint)-(int)uVar31;
        }
        local_b4.row = (short)uVar23 + (short)uVar30;
        local_b4.col = (short)uVar17 + (short)uVar28;
        if (((iVar12 <= local_b4.col) && ((int)local_b4.col <= (pSVar27->mv_limits).col_max)) &&
           (((pSVar27->mv_limits).row_min <= (int)local_b4.row &&
            ((int)local_b4.row <= (pSVar27->mv_limits).row_max)))) {
          local_b0 = uVar20;
          local_80 = uVar23;
          local_78 = uVar17;
          iVar12 = upsampled_pref_error(local_98,local_88,&local_b4,local_a0,(uint *)&left_mv_1);
          MVar3 = (pSVar27->mv_cost_params).mv_cost_type;
          iVar14 = 0;
          if (MVar3 != '\x04') {
            sVar6 = local_a8->ref_mv->row;
            sVar15 = local_a8->ref_mv->col;
            sVar26 = local_b4.row - sVar6;
            sVar24 = local_b4.col - sVar15;
            sVar25 = -sVar26;
            if (0 < sVar26) {
              sVar25 = sVar26;
            }
            sVar29 = -sVar24;
            if (0 < sVar24) {
              sVar29 = sVar24;
            }
            if (MVar3 == '\x03') {
              iVar14 = (int)sVar29 + (int)sVar25 >> 3;
            }
            else if (MVar3 == '\x01') {
              iVar14 = (int)sVar29 + (int)sVar25 >> 2;
            }
            else if (MVar3 == '\0') {
              local_90 = (ulong)(local_d8->mv_cost_params).error_per_bit;
              iVar14 = (int)(((long)(local_d8->mv_cost_params).mvcost[1][sVar24] +
                              (long)(local_d8->mv_cost_params).mvcost[0][sVar26] +
                             (long)*(int *)((long)(local_d8->mv_cost_params).mvjcost +
                                           (ulong)((uint)(local_b4.col != sVar15) * 4 +
                                                  (uint)(local_b4.row != sVar6) * 8))) * local_90 +
                             0x2000 >> 0xe);
            }
          }
          uVar17 = local_78;
          uVar20 = local_b0;
          pSVar21 = local_70;
          uVar23 = local_80;
          pSVar27 = local_d8;
          if ((uint)(iVar14 + iVar12) < local_dc) {
            *local_68 = local_b4;
            *distortion = iVar12;
            *sse1 = (uint)left_mv_1;
            local_dc = iVar14 + iVar12;
          }
        }
        uVar18 = (uint)uVar30 & 0xffff | (int)uVar28 << 0x10;
        bestmv = local_68;
      }
      pAVar10 = local_88;
      pMVar9 = local_98;
      pSVar8 = local_a0;
      pMVar7 = local_a8;
      sVar6 = bestmv->row;
      sVar25 = (short)uVar17;
      sVar15 = (short)(uVar18 >> 0x10);
      uVar17 = uVar20;
      if ((short)uVar23 == sVar6) {
        if ((sVar25 != bestmv->col && 1 < local_4c) &&
           (left_mv.col = bestmv->col, sVar25 != left_mv.col)) {
          uVar18 = -uVar18;
          sVar26 = sVar15;
LAB_001d39d7:
          left_mv.row = (short)uVar18 + sVar6;
          right_mv.col = left_mv.col + sVar26;
          right_mv.row = sVar6;
          top_mv.col = left_mv.col + sVar26;
          top_mv.row = left_mv.row;
          bottom_mv.row = 0;
          bottom_mv.col = 0;
          local_90 = uVar31;
          if ((pSVar27->var_params).subpel_search_type == '\0') {
            iVar12 = (int)local_60;
            local_b0 = uVar20;
            check_better_fast(local_98,local_88,&left_mv,bestmv,local_70,local_a0,local_a8,&local_dc
                              ,sse1,distortion,(int *)&bottom_mv,iVar12);
            pSVar21 = local_70;
            check_better_fast(pMVar9,pAVar10,&right_mv,bestmv,local_70,pSVar8,pMVar7,&local_dc,sse1,
                              distortion,(int *)&bottom_mv,iVar12);
            uVar17 = local_b0;
            pSVar27 = local_d8;
            uVar31 = local_90;
            if (bottom_mv != (MV)0x0) {
              check_better_fast(local_98,local_88,&top_mv,bestmv,pSVar21,local_a0,local_a8,&local_dc
                                ,sse1,distortion,(int *)&bottom_mv,(int)local_60);
              uVar17 = local_b0;
              pSVar27 = local_d8;
              uVar31 = local_90;
            }
          }
          else {
            iVar12 = pSVar21->col_min;
            bVar32 = false;
            if ((((iVar12 <= left_mv.col) && ((int)left_mv.col <= (pSVar27->mv_limits).col_max)) &&
                ((pSVar27->mv_limits).row_min <= (int)left_mv.row)) &&
               (bVar32 = false, (int)left_mv.row <= (pSVar27->mv_limits).row_max)) {
              local_b0 = uVar20;
              iVar12 = upsampled_pref_error(local_98,local_88,&left_mv,local_a0,(uint *)&left_mv_1);
              MVar3 = (pSVar27->mv_cost_params).mv_cost_type;
              iVar14 = 0;
              if (MVar3 != '\x04') {
                sVar6 = local_a8->ref_mv->row;
                sVar15 = local_a8->ref_mv->col;
                sVar24 = left_mv.row - sVar6;
                sVar26 = left_mv.col - sVar15;
                sVar25 = -sVar24;
                if (0 < sVar24) {
                  sVar25 = sVar24;
                }
                sVar29 = -sVar26;
                if (0 < sVar26) {
                  sVar29 = sVar26;
                }
                if (MVar3 == '\x03') {
                  iVar14 = (int)sVar29 + (int)sVar25 >> 3;
                }
                else if (MVar3 == '\x01') {
                  iVar14 = (int)sVar29 + (int)sVar25 >> 2;
                }
                else {
                  iVar14 = 0;
                  if (MVar3 == '\0') {
                    iVar14 = (int)(((long)(local_d8->mv_cost_params).mvcost[1][sVar26] +
                                    (long)(local_d8->mv_cost_params).mvcost[0][sVar24] +
                                   (long)*(int *)((long)(local_d8->mv_cost_params).mvjcost +
                                                 (ulong)((uint)(left_mv.col != sVar15) * 4 +
                                                        (uint)(left_mv.row != sVar6) * 8))) *
                                   (long)(local_d8->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
                    bestmv = local_68;
                    pSVar21 = local_70;
                  }
                }
              }
              bVar32 = (uint)(iVar14 + iVar12) < local_dc;
              if (bVar32) {
                *bestmv = left_mv;
                *distortion = iVar12;
                *sse1 = (uint)left_mv_1;
                local_dc = iVar14 + iVar12;
              }
              iVar12 = pSVar21->col_min;
              uVar20 = local_b0;
              pSVar27 = local_d8;
            }
            uVar17 = uVar20;
            if (((iVar12 <= (int)right_mv >> 0x10) &&
                ((int)right_mv >> 0x10 <= (pSVar27->mv_limits).col_max)) &&
               (((pSVar27->mv_limits).row_min <= (int)right_mv.row &&
                ((int)right_mv.row <= (pSVar27->mv_limits).row_max)))) {
              local_b0 = uVar20;
              iVar12 = upsampled_pref_error(local_98,local_88,&right_mv,local_a0,(uint *)&left_mv_1)
              ;
              MVar3 = (pSVar27->mv_cost_params).mv_cost_type;
              iVar14 = 0;
              if (MVar3 != '\x04') {
                sVar6 = local_a8->ref_mv->row;
                sVar15 = local_a8->ref_mv->col;
                sVar26 = right_mv.row - sVar6;
                sVar24 = right_mv.col - sVar15;
                sVar25 = -sVar26;
                if (0 < sVar26) {
                  sVar25 = sVar26;
                }
                sVar29 = -sVar24;
                if (0 < sVar24) {
                  sVar29 = sVar24;
                }
                if (MVar3 == '\x03') {
                  iVar14 = (int)sVar29 + (int)sVar25 >> 3;
                }
                else if (MVar3 == '\x01') {
                  iVar14 = (int)sVar29 + (int)sVar25 >> 2;
                }
                else if (MVar3 == '\0') {
                  iVar14 = (int)(((long)(local_d8->mv_cost_params).mvcost[1][sVar24] +
                                  (long)(local_d8->mv_cost_params).mvcost[0][sVar26] +
                                 (long)*(int *)((long)(local_d8->mv_cost_params).mvjcost +
                                               (ulong)((uint)(right_mv.col != sVar15) * 4 +
                                                      (uint)(right_mv.row != sVar6) * 8))) *
                                 (long)(local_d8->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
                  bestmv = local_68;
                }
              }
              uVar17 = local_b0;
              pSVar21 = local_70;
              pSVar27 = local_d8;
              if ((uint)(iVar14 + iVar12) < local_dc) {
                *bestmv = right_mv;
                *distortion = iVar12;
                *sse1 = (uint)left_mv_1;
                bottom_mv.row = 1;
                bottom_mv.col = 0;
                bVar32 = true;
                local_dc = iVar14 + iVar12;
              }
            }
            uVar31 = local_90;
            if (((bVar32) && (pSVar21->col_min <= (int)top_mv >> 0x10)) &&
               (((int)top_mv >> 0x10 <= (pSVar27->mv_limits).col_max &&
                (((pSVar27->mv_limits).row_min <= (int)top_mv.row &&
                 ((int)top_mv.row <= (pSVar27->mv_limits).row_max)))))) {
              iVar12 = upsampled_pref_error(local_98,local_88,&top_mv,local_a0,(uint *)&left_mv_1);
              MVar3 = (pSVar27->mv_cost_params).mv_cost_type;
              iVar14 = 0;
              if (MVar3 != '\x04') {
                sVar6 = local_a8->ref_mv->row;
                sVar15 = local_a8->ref_mv->col;
                sVar26 = top_mv.row - sVar6;
                sVar24 = top_mv.col - sVar15;
                sVar25 = -sVar26;
                if (0 < sVar26) {
                  sVar25 = sVar26;
                }
                sVar29 = -sVar24;
                if (0 < sVar24) {
                  sVar29 = sVar24;
                }
                if (MVar3 == '\x03') {
                  iVar14 = (int)sVar29 + (int)sVar25 >> 3;
                }
                else if (MVar3 == '\x01') {
                  iVar14 = (int)sVar29 + (int)sVar25 >> 2;
                }
                else if (MVar3 == '\0') {
                  iVar14 = (int)(((long)(local_d8->mv_cost_params).mvcost[1][sVar24] +
                                  (long)(local_d8->mv_cost_params).mvcost[0][sVar26] +
                                 (long)*(int *)((long)(local_d8->mv_cost_params).mvjcost +
                                               (ulong)((uint)(top_mv.col != sVar15) * 4 +
                                                      (uint)(top_mv.row != sVar6) * 8))) *
                                 (long)(local_d8->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
                  bestmv = local_68;
                  pSVar21 = local_70;
                }
              }
              pSVar27 = local_d8;
              uVar31 = local_90;
              if ((uint)(iVar14 + iVar12) < local_dc) {
                *bestmv = top_mv;
                *distortion = iVar12;
                *sse1 = (uint)left_mv_1;
                local_dc = iVar14 + iVar12;
              }
            }
          }
        }
      }
      else if (1 < local_4c) {
        left_mv.col = bestmv->col;
        sVar26 = -sVar15;
        if (sVar25 != left_mv.col) {
          sVar26 = sVar15;
        }
        goto LAB_001d39d7;
      }
      uVar31 = uVar31 >> 1 & 0x7fffffff;
      bVar32 = uVar17 < local_38;
      uVar20 = uVar17 + 1;
    } while (local_40 + uVar17 != 0);
    uVar11 = 0x7fffffff;
    if (!bVar32) {
      uVar11 = local_dc;
    }
  }
  return uVar11;
}

Assistant:

int av1_find_best_sub_pixel_tree(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                 const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                 MV start_mv,
                                 const FULLPEL_MV_STATS *start_mv_stats,
                                 MV *bestmv, int *distortion,
                                 unsigned int *sse1,
                                 int_mv *last_mv_search_list) {
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const SUBPEL_SEARCH_TYPE subpel_search_type =
      ms_params->var_params.subpel_search_type;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  // How many steps to take. A round of 0 means fullpel search only, 1 means
  // half-pel, and so on.
  const int round = AOMMIN(FULL_PEL - forced_stop, 3 - !allow_hp);
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel

  unsigned int besterr = INT_MAX;

  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    if (subpel_search_type != USE_2_TAPS_ORIG) {
      besterr = upsampled_setup_center_error(xd, cm, bestmv, var_params,
                                             mv_cost_params, sse1, distortion);
    } else {
      besterr = setup_center_error(xd, bestmv, var_params, mv_cost_params, sse1,
                                   distortion);
    }
  }

  // If forced_stop is FULL_PEL, return.
  if (!round) return besterr;

  for (int iter = 0; iter < round; ++iter) {
    MV iter_center_mv = *bestmv;
    if (check_repeated_mv_and_update(last_mv_search_list, iter_center_mv,
                                     iter)) {
      return INT_MAX;
    }

    MV diag_step;
    if (subpel_search_type != USE_2_TAPS_ORIG) {
      diag_step = first_level_check(xd, cm, iter_center_mv, bestmv, hstep,
                                    mv_limits, var_params, mv_cost_params,
                                    &besterr, sse1, distortion);
    } else {
      diag_step = first_level_check_fast(xd, cm, iter_center_mv, bestmv, hstep,
                                         mv_limits, var_params, mv_cost_params,
                                         &besterr, sse1, distortion, is_scaled);
    }

    // Check diagonal sub-pixel position
    if (!CHECK_MV_EQUAL(iter_center_mv, *bestmv) && iters_per_step > 1) {
      second_level_check_v2(xd, cm, iter_center_mv, diag_step, bestmv,
                            mv_limits, var_params, mv_cost_params, &besterr,
                            sse1, distortion, is_scaled);
    }

    hstep >>= 1;
  }

  return besterr;
}